

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerSettings.cpp
# Opt level: O2

void __thiscall I2cAnalyzerSettings::I2cAnalyzerSettings(I2cAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_02;
  AnalyzerSettingInterfaceChannel *pAVar1;
  ulong uVar2;
  Channel *pCVar3;
  uint uVar4;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__I2cAnalyzerSettings_0010ad70;
  this_00 = &this->mSdaChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  uVar2 = 0xffffffffffffffff;
  Channel::Channel(&this->mSclChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mSdaChannelInterface;
  this_02 = &this->mSclChannelInterface;
  (this->mSdaChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mSclChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar2);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"SDA");
  pCVar3 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar3);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_02,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"SCL");
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_02->_M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar4 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar4,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar4,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSclChannel,true);
  return;
}

Assistant:

I2cAnalyzerSettings::I2cAnalyzerSettings() : mSdaChannel( UNDEFINED_CHANNEL ), mSclChannel( UNDEFINED_CHANNEL )
{
    mSdaChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSdaChannelInterface->SetTitleAndTooltip( "SDA", "Serial Data Line" );
    mSdaChannelInterface->SetChannel( mSdaChannel );

    mSclChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mSclChannelInterface->SetTitleAndTooltip( "SCL", "Serial Clock Line" );
    mSclChannelInterface->SetChannel( mSclChannel );

    AddInterface( mSdaChannelInterface.get() );
    AddInterface( mSclChannelInterface.get() );

    // AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mSdaChannel, "SDA", false );
    AddChannel( mSclChannel, "SCL", false );
}